

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reg_alloc.cpp
# Opt level: O2

Reg __thiscall
backend::codegen::RegAllocator::alloc_transient_reg
          (RegAllocator *this,Interval i,optional<unsigned_int> orig)

{
  list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *plVar1;
  Reg RVar2;
  int iVar3;
  ostream *poVar4;
  iterator iVar5;
  iterator iVar6;
  runtime_error *this_00;
  __node_base *p_Var7;
  Interval tag;
  Function *pFVar8;
  char *tag_00;
  Tag *pTVar9;
  const_iterator cVar10;
  _Storage<unsigned_int,_true> r_00;
  Reg r;
  allocator<char> local_292;
  ostream local_291;
  undefined1 local_290 [15];
  allocator<char> local_281;
  undefined1 local_280 [32];
  string local_260;
  Tag local_240;
  Interval local_210;
  anon_class_16_2_d7082aa3 alloc_using_glob;
  anon_class_16_2_d7082aa3 alloc_using_temp;
  undefined **local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0;
  pair<unsigned_int,_unsigned_int> x;
  short local_1a8 [188];
  
  r = 0xffffffff;
  r_00._M_value =
       orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_int>._M_payload;
  if (((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) {
LAB_00160e27:
    x.first = i.start;
    local_210 = i;
    alloc_using_glob.r = &r;
    alloc_using_glob.this = this;
    alloc_using_temp.r = &r;
    alloc_using_temp.this = this;
    iVar5 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            lower_bound(&(this->bl_points)._M_t,(key_type *)&x);
    x.first = i.end;
    iVar6 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            upper_bound(&(this->bl_points)._M_t,(key_type *)&x);
    if (iVar5._M_node == iVar6._M_node) {
      alloc_transient_reg::anon_class_16_2_d7082aa3::operator()(&alloc_using_temp);
      alloc_transient_reg::anon_class_16_2_d7082aa3::operator()(&alloc_using_glob);
    }
    else {
      alloc_transient_reg::anon_class_16_2_d7082aa3::operator()(&alloc_using_glob);
      alloc_transient_reg::anon_class_16_2_d7082aa3::operator()(&alloc_using_temp);
    }
    if (r == 0xffffffff) {
      if ((this->active_reg_map).
          super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          ._M_impl._M_node._M_size == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&x);
        poVar4 = std::operator<<((ostream *)local_1a8,
                                 "Failed to allocate: all active registers are temporary!");
        poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
        poVar4 = std::operator<<(poVar4,"Dump: ");
        std::endl<char,std::char_traits<char>>(poVar4);
        p_Var7 = &(this->active)._M_h._M_before_begin;
        while (p_Var7 = p_Var7->_M_nxt, p_Var7 != (__node_base *)0x0) {
          arm::display_reg_name((ostream *)local_1a8,(Reg)*(size_type *)(p_Var7 + 1));
          poVar4 = std::operator<<((ostream *)local_1a8,": [");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,", ");
          poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
          poVar4 = std::operator<<(poVar4,"]");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        std::runtime_error::runtime_error(this_00,(string *)(local_280 + 0x40));
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      plVar1 = &this->active_reg_map;
      local_290._0_8_ =
           (this->active_reg_map).
           super__List_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
           ._M_impl._M_node.super__List_node_base._M_next[1]._M_next;
      std::__cxx11::
      list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::pop_front(plVar1);
      std::__detail::
      _Map_base<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)&this->active,(key_type *)(local_290 + 4));
      iVar3 = get_or_alloc_spill_pos(this,local_290._0_4_);
      local_260._M_dataplus._M_p._0_4_ = 0x1c;
      local_1a8[0] = (short)this->stack_offset + (short)iVar3;
      x.first = 0x1db800;
      x.second = 0;
      local_1a8[8]._0_1_ = '\x01';
      std::
      make_unique<arm::LoadStoreInst,arm::OpCode,unsigned_int&,arm::MemoryOperand,arm::ConditionCode&>
                ((OpCode *)local_280,(uint *)(local_280 + 0x20),(MemoryOperand *)(local_290 + 4),
                 (ConditionCode *)&x);
      local_240._vptr_Tag = (_func_int **)local_280._0_8_;
      local_280._0_8_ = (LoadStoreInst *)0x0;
      pTVar9 = (Tag *)(local_280 + 0x40);
      std::
      vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
      ::emplace_back<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>
                ((vector<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>,std::allocator<std::unique_ptr<arm::Inst,std::default_delete<arm::Inst>>>>
                  *)&this->inst_sink,
                 (unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_> *)pTVar9);
      if (local_240._vptr_Tag != (_func_int **)0x0) {
        (**(code **)(*local_240._vptr_Tag + 0x10))();
      }
      local_240._vptr_Tag = (_func_int **)0x0;
      std::unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_>::~unique_ptr
                ((unique_ptr<arm::LoadStoreInst,_std::default_delete<arm::LoadStoreInst>_> *)
                 local_280);
      local_291 = (ostream)0x0;
      AixLog::operator<<(&local_291,(Severity *)pTVar9);
      AixLog::Tag::Tag((Tag *)(local_280 + 0x40));
      AixLog::operator<<((ostream *)(local_280 + 0x40),pTVar9);
      local_1c8 = std::chrono::_V2::system_clock::now();
      local_1d0 = &PTR__Timestamp_001d8f28;
      local_1c0 = 0;
      AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)pTVar9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_280,"alloc_transient_reg",&local_292);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_280 + 0x20),
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
                 ,&local_281);
      pFVar8 = (Function *)local_280;
      AixLog::Function::Function((Function *)&x,(string *)pFVar8,(string *)(local_280 + 0x20),0x247)
      ;
      AixLog::operator<<((ostream *)&x,pFVar8);
      AixLog::Function::~Function((Function *)&x);
      std::__cxx11::string::~string((string *)(local_280 + 0x20));
      std::__cxx11::string::~string((string *)local_280);
      AixLog::Tag::~Tag((Tag *)(local_280 + 0x40));
      std::operator<<((ostream *)&std::clog,"Spilling: ");
      arm::display_reg_name((ostream *)&std::clog,local_290._4_4_);
      std::operator<<((ostream *)&std::clog," -> ");
      arm::display_reg_name((ostream *)&std::clog,local_290._0_4_);
      poVar4 = std::operator<<((ostream *)&std::clog," -> ");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar3);
      std::operator<<(poVar4," ");
      r = local_290._4_4_;
      x.first = local_290._0_4_;
      x.second = local_210.start;
      std::
      _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
      ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
                ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                  *)&this->spilled_regs,&x);
      cVar10._M_node = (_List_node_base *)plVar1;
      do {
        cVar10._M_node = (cVar10._M_node)->_M_next;
        if (cVar10._M_node == (_List_node_base *)plVar1) goto LAB_0016116a;
      } while ((((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                        super__Optional_payload_base<unsigned_int> >> 0x20 & 1) == 0) ||
              (*(uint *)&cVar10._M_node[1]._M_next != r_00._M_value));
      std::__cxx11::
      list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::erase(plVar1,cVar10);
LAB_0016116a:
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_backend::codegen::Interval>,_std::allocator<std::pair<const_unsigned_int,_backend::codegen::Interval>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&(this->active)._M_h,local_290 + 4);
    }
    pTVar9 = (Tag *)&x;
    x.first = r;
    x.second = local_210.start;
    std::
    _Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_int_const,backend::codegen::Interval>>
              ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,backend::codegen::Interval>,std::allocator<std::pair<unsigned_int_const,backend::codegen::Interval>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->active);
    if (((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_int> >> 0x20 & 1) != 0) {
      pTVar9 = (Tag *)&x;
      x.second = r;
      x.first = r_00._M_value;
      std::__cxx11::
      list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ::push_back(&this->active_reg_map,(value_type *)pTVar9);
    }
    local_290._0_8_ = local_290._0_8_ & 0xffffffffffffff00;
    AixLog::operator<<((ostream *)local_290,(Severity *)pTVar9);
    AixLog::Tag::Tag((Tag *)(local_280 + 0x40));
    AixLog::operator<<((ostream *)(local_280 + 0x40),pTVar9);
    local_1c8 = std::chrono::_V2::system_clock::now();
    local_1d0 = &PTR__Timestamp_001d8f28;
    local_1c0 = 0;
    AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)pTVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"alloc_transient_reg",(allocator<char> *)&local_291);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_280 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,&local_292);
    pFVar8 = (Function *)local_280;
    AixLog::Function::Function((Function *)&x,(string *)pFVar8,(string *)(local_280 + 0x20),0x260);
    AixLog::operator<<((ostream *)&x,pFVar8);
    poVar4 = std::operator<<((ostream *)&std::clog,"-> ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    AixLog::Function::~Function((Function *)&x);
    std::__cxx11::string::~string((string *)(local_280 + 0x20));
    std::__cxx11::string::~string((string *)local_280);
    AixLog::Tag::~Tag((Tag *)(local_280 + 0x40));
    display_active_regs(this);
  }
  else {
    alloc_using_temp.r = (Reg *)((ulong)alloc_using_temp.r & 0xffffffffffffff00);
    tag = i;
    AixLog::operator<<((ostream *)&alloc_using_temp,(Severity *)i);
    AixLog::Tag::Tag((Tag *)(local_280 + 0x40));
    AixLog::operator<<((ostream *)(local_280 + 0x40),(Tag *)tag);
    local_1c8 = std::chrono::_V2::system_clock::now();
    local_1d0 = &PTR__Timestamp_001d8f28;
    local_1c0 = 0;
    AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)tag);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"alloc_transient_reg",(allocator<char> *)&alloc_using_glob);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_280 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,(allocator<char> *)local_290);
    pFVar8 = (Function *)local_280;
    AixLog::Function::Function((Function *)&x,(string *)pFVar8,(string *)(local_280 + 0x20),0x1f6);
    AixLog::operator<<((ostream *)&x,pFVar8);
    tag_00 = "orig ";
    std::operator<<((ostream *)&std::clog,"orig ");
    AixLog::Function::~Function((Function *)&x);
    std::__cxx11::string::~string((string *)(local_280 + 0x20));
    std::__cxx11::string::~string((string *)local_280);
    AixLog::Tag::~Tag((Tag *)(local_280 + 0x40));
    alloc_using_temp.r = (Reg *)((ulong)alloc_using_temp.r & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&alloc_using_temp,(Severity *)tag_00);
    AixLog::Tag::Tag((Tag *)(local_280 + 0x40));
    AixLog::operator<<((ostream *)(local_280 + 0x40),(Tag *)tag_00);
    local_1c8 = std::chrono::_V2::system_clock::now();
    local_1d0 = &PTR__Timestamp_001d8f28;
    local_1c0 = 0;
    AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)tag_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"alloc_transient_reg",(allocator<char> *)&alloc_using_glob);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_280 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,(allocator<char> *)local_290);
    pFVar8 = (Function *)local_280;
    AixLog::Function::Function((Function *)&x,(string *)pFVar8,(string *)(local_280 + 0x20),0x1f7);
    AixLog::operator<<((ostream *)&x,pFVar8);
    pTVar9 = (Tag *)((ulong)orig.super__Optional_base<unsigned_int,_true,_true>._M_payload.
                            super__Optional_payload_base<unsigned_int> & 0xffffffff);
    arm::display_reg_name((ostream *)&std::clog,r_00._M_value);
    AixLog::Function::~Function((Function *)&x);
    std::__cxx11::string::~string((string *)(local_280 + 0x20));
    std::__cxx11::string::~string((string *)local_280);
    AixLog::Tag::~Tag((Tag *)(local_280 + 0x40));
    alloc_using_temp.r = (Reg *)((ulong)alloc_using_temp.r & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&alloc_using_temp,(Severity *)pTVar9);
    AixLog::Tag::Tag((Tag *)(local_280 + 0x40));
    AixLog::operator<<((ostream *)(local_280 + 0x40),pTVar9);
    local_1c8 = std::chrono::_V2::system_clock::now();
    local_1d0 = &PTR__Timestamp_001d8f28;
    local_1c0 = 0;
    AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)pTVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"alloc_transient_reg",(allocator<char> *)&alloc_using_glob);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_280 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,(allocator<char> *)local_290);
    pFVar8 = (Function *)local_280;
    AixLog::Function::Function((Function *)&x,(string *)pFVar8,(string *)(local_280 + 0x20),0x1f8);
    AixLog::operator<<((ostream *)&x,pFVar8);
    pTVar9 = (Tag *)0x194562;
    std::operator<<((ostream *)&std::clog," ");
    AixLog::Function::~Function((Function *)&x);
    std::__cxx11::string::~string((string *)(local_280 + 0x20));
    std::__cxx11::string::~string((string *)local_280);
    AixLog::Tag::~Tag((Tag *)(local_280 + 0x40));
    plVar1 = &this->active_reg_map;
    cVar10._M_node = (_List_node_base *)plVar1;
    do {
      cVar10._M_node = (cVar10._M_node)->_M_next;
      if (cVar10._M_node == (_List_node_base *)plVar1) goto LAB_00160e27;
    } while (*(uint *)&cVar10._M_node[1]._M_next != r_00._M_value);
    alloc_using_temp.r = (Reg *)((ulong)alloc_using_temp.r & 0xffffffffffffff00);
    AixLog::operator<<((ostream *)&alloc_using_temp,(Severity *)pTVar9);
    AixLog::Tag::Tag((Tag *)(local_280 + 0x40));
    AixLog::operator<<((ostream *)(local_280 + 0x40),pTVar9);
    local_1c8 = std::chrono::_V2::system_clock::now();
    local_1d0 = &PTR__Timestamp_001d8f28;
    local_1c0 = 0;
    AixLog::operator<<((ostream *)&local_1d0,(Timestamp *)pTVar9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_280,"alloc_transient_reg",(allocator<char> *)&alloc_using_glob);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(local_280 + 0x20),
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/reg_alloc.cpp"
               ,(allocator<char> *)local_290);
    pFVar8 = (Function *)local_280;
    AixLog::Function::Function((Function *)&x,(string *)pFVar8,(string *)(local_280 + 0x20),0x201);
    AixLog::operator<<((ostream *)&x,pFVar8);
    poVar4 = std::operator<<((ostream *)&std::clog,"r-> ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    AixLog::Function::~Function((Function *)&x);
    std::__cxx11::string::~string((string *)(local_280 + 0x20));
    std::__cxx11::string::~string((string *)local_280);
    AixLog::Tag::~Tag((Tag *)(local_280 + 0x40));
    RVar2 = *(Reg *)((long)&cVar10._M_node[1]._M_next + 4);
    x.first = (uint)cVar10._M_node[1]._M_next;
    x.second = (uint)((ulong)cVar10._M_node[1]._M_next >> 0x20);
    std::__cxx11::
    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::erase(plVar1,cVar10);
    std::__cxx11::
    list<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
    ::push_back(plVar1,&x);
    r = RVar2;
  }
  return r;
}

Assistant:

Reg RegAllocator::alloc_transient_reg(Interval i, std::optional<Reg> orig) {
  Reg r = -1;
  if (orig) {
    LOG(TRACE) << "orig ";
    display_reg_name(LOG(TRACE), orig.value());
    LOG(TRACE) << " ";
    auto it = active_reg_map.begin();
    while (it != active_reg_map.end()) {
      if (it->first == orig)
        break;
      else
        it++;
    }
    if (it != active_reg_map.end()) {
      LOG(TRACE) << "r-> " << it->second << std::endl;
      auto r = it->second;
      auto x = *it;
      active_reg_map.erase(it);
      active_reg_map.push_back(x);
      return r;
    }
  }
  auto alloc_using_temp = [&]() {
    if (r == -1) {
      for (auto reg : TEMP_REGS) {
        if (active.find(reg) == active.end()) {
          r = reg;
          break;
        }
      }
    }
  };
  auto alloc_using_glob = [&]() {
    if (r == -1) {
      for (auto reg : GLOB_REGS) {
        if (active.find(reg) == active.end() &&
            used_regs.find(reg) == used_regs.end()) {
          r = reg;
          used_regs_temp.insert(reg);
          break;
        }
      }
    }
  };
  {
    auto lower_bound = bl_points.lower_bound(i.start);
    auto upper_bound = bl_points.upper_bound(i.end);
    if (lower_bound != upper_bound) {
      // Cross-BL virtual register
      alloc_using_glob();
      alloc_using_temp();
    } else {
      // non-cross-bl virtual register
      alloc_using_temp();
      alloc_using_glob();
    }
  }
  if (r == -1) {
    // Choose a value in active to spill.
    // NOTE: the current algorithm chooses the earliest-allocated register
    if (active_reg_map.size() == 0) {
      std::stringstream ss;
      ss << "Failed to allocate: all active registers are "
            "temporary!"
         << std::endl
         << "Dump: " << std::endl;

      for (auto [k, v] : active) {
        display_reg_name(ss, k);
        ss << ": [" << v.start << ", " << v.end << "]" << std::endl;
      }

      throw std::runtime_error(ss.str());
    }
    auto [spill_virt, spill_phys] = active_reg_map.front();
    active_reg_map.pop_front();
    auto interval = active.at(spill_phys);
    interval.start = i.start;
    int spill_pos = get_or_alloc_spill_pos(spill_virt);
    // TODO: move this into a separate function
    inst_sink.push_back(std::make_unique<LoadStoreInst>(
        OpCode::StR, spill_phys,
        MemoryOperand(REG_SP, spill_pos + stack_offset), cur_cond));

    auto &trace = LOG(TRACE);
    trace << "Spilling: ";
    display_reg_name(trace, spill_phys);
    trace << " -> ";
    display_reg_name(trace, spill_virt);
    trace << " -> " << spill_pos << " ";

    r = spill_phys;
    spilled_regs.insert({spill_virt, interval});
    {
      auto it = active_reg_map.begin();
      while (it != active_reg_map.end()) {
        if (it->first == orig) {
          active_reg_map.erase(it);
          break;
        } else
          it++;
      }
    }
    active.erase(spill_phys);
  }
  this->active.insert({r, i});
  if (orig) {
    this->active_reg_map.push_back({orig.value(), r});
  }
  LOG(TRACE) << "-> " << r << std::endl;
  display_active_regs();
  return r;
}